

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O0

REF_STATUS
ref_smooth_node_same_tangent
          (REF_GRID ref_grid,REF_INT node,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_NODE pRVar1;
  REF_STATUS ref_private_macro_code_rsb;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT i;
  REF_DBL dot;
  REF_DBL tan1 [3];
  double local_58;
  REF_DBL tan0 [3];
  REF_NODE ref_node;
  REF_BOOL *allowed_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->node;
  *allowed = 1;
  for (ref_private_macro_code_rsb = 0; ref_private_macro_code_rsb < 3;
      ref_private_macro_code_rsb = ref_private_macro_code_rsb + 1) {
    tan0[(long)ref_private_macro_code_rsb + -1] =
         pRVar1->real[ref_private_macro_code_rsb + node * 0xf] -
         pRVar1->real[ref_private_macro_code_rsb + node0 * 0xf];
  }
  for (ref_private_macro_code_rsb = 0; ref_private_macro_code_rsb < 3;
      ref_private_macro_code_rsb = ref_private_macro_code_rsb + 1) {
    tan1[(long)ref_private_macro_code_rsb + -1] =
         pRVar1->real[ref_private_macro_code_rsb + node1 * 0xf] -
         pRVar1->real[ref_private_macro_code_rsb + node * 0xf];
  }
  ref_grid_local._4_4_ = ref_math_normalize(&local_58);
  if (ref_grid_local._4_4_ == 0) {
    ref_grid_local._4_4_ = ref_math_normalize(&dot);
    if (ref_grid_local._4_4_ == 0) {
      if (pRVar1->same_normal_tol <= tan0[1] * tan1[1] + local_58 * dot + tan0[0] * tan1[0]) {
        ref_grid_local._4_4_ = 0;
      }
      else {
        *allowed = 0;
        ref_grid_local._4_4_ = 0;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x2e2,"ref_smooth_node_same_tangent",(ulong)ref_grid_local._4_4_,"edge 1 zero length");
      printf("nodes %d %d %d\n",(ulong)(uint)node0,(ulong)(uint)node,(ulong)(uint)node1);
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0x2e0,
           "ref_smooth_node_same_tangent",(ulong)ref_grid_local._4_4_,"edge 0 zero length");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_node_same_tangent(REF_GRID ref_grid,
                                                       REF_INT node,
                                                       REF_INT node0,
                                                       REF_INT node1,
                                                       REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL tan0[3], tan1[3];
  REF_DBL dot;
  REF_INT i;

  *allowed = REF_TRUE;
  for (i = 0; i < 3; i++)
    tan0[i] =
        ref_node_xyz(ref_node, i, node) - ref_node_xyz(ref_node, i, node0);
  for (i = 0; i < 3; i++)
    tan1[i] =
        ref_node_xyz(ref_node, i, node1) - ref_node_xyz(ref_node, i, node);

  RSS(ref_math_normalize(tan0), "edge 0 zero length");
  RSB(ref_math_normalize(tan1), "edge 1 zero length",
      { printf("nodes %d %d %d\n", node0, node, node1); });

  dot = ref_math_dot(tan0, tan1);
  if (dot < ref_node_same_normal_tol(ref_node)) {
    *allowed = REF_FALSE;
    return REF_SUCCESS;
  }

  return REF_SUCCESS;
}